

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mustache.cpp
# Opt level: O2

QString * __thiscall
Mustache::PartialFileLoader::getPartial
          (QString *__return_storage_ptr__,PartialFileLoader *this,QString *name)

{
  QHash<QString,_QString> *this_00;
  bool bVar1;
  char cVar2;
  QFile file;
  QArrayDataPointer<char16_t> local_70;
  QTextStream stream;
  QString path;
  
  this_00 = &this->m_cache;
  bVar1 = QHash<QString,_QString>::contains(this_00,name);
  if (!bVar1) {
    operator+((QString *)&file,&this->m_basePath,(QChar)0x2f);
    operator+((QString *)&local_70,(QString *)&file,name);
    operator+(&path,(QString *)&local_70,".mustache");
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_70);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&file);
    QFile::QFile(&file,(QString *)&path);
    cVar2 = QFile::open(&file,1);
    if (cVar2 != '\0') {
      QTextStream::QTextStream(&stream,(QIODevice *)&file);
      QTextStream::readAll();
      QHash<QString,QString>::emplace<QString_const&>
                ((QHash<QString,QString> *)this_00,name,(QString *)&local_70);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_70);
      QTextStream::~QTextStream(&stream);
    }
    QFile::~QFile(&file);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&path.d);
  }
  path.d.d = (Data *)0x0;
  path.d.ptr = (char16_t *)0x0;
  path.d.size = 0;
  QHash<QString,_QString>::value(__return_storage_ptr__,this_00,name,(QString *)&path.d);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&path.d);
  return __return_storage_ptr__;
}

Assistant:

QString PartialFileLoader::getPartial(const QString& name)
{
	if (!m_cache.contains(name)) {
		QString path = m_basePath + '/' + name + ".mustache";
		QFile file(path);
		if (file.open(QIODevice::ReadOnly)) {
			QTextStream stream(&file);
			m_cache.insert(name, stream.readAll());
		}
	}
	return m_cache.value(name);
}